

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O1

void __thiscall Satyricon::SATSolver::cancel_until(SATSolver *this,int level)

{
  ostream *this_00;
  long *plVar1;
  
  if (1 < this->log_level) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"backtrack from ",0xf);
    this_00 = (ostream *)
              std::ostream::operator<<
                        (&std::cout,
                         (int)((ulong)((long)(this->trail_limit).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_finish -
                                      (long)(this->trail_limit).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start) >> 2));
    std::__ostream_insert<char,std::char_traits<char>>(this_00," to ",4);
    plVar1 = (long *)std::ostream::operator<<(this_00,level);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
  }
  while (level < (int)((ulong)((long)(this->trail_limit).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->trail_limit).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2)) {
    cancel(this);
  }
  this->propagation_starting_pos =
       (long)(this->trail).
             super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->trail).
             super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
             super__Vector_impl_data._M_start >> 2;
  return;
}

Assistant:

void SATSolver::cancel_until( int level ) {
    PRINT_VERBOSE("backtrack from " << current_level() <<
            " to " << level << endl);
    while ( current_level() > level )
        cancel();
    propagation_starting_pos = trail.size();
}